

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

void Curl_expire(SessionHandle *data,long milli)

{
  Curl_multi *pCVar1;
  uint uVar2;
  timeval *stamp;
  long lVar3;
  Curl_tree *pCVar4;
  timeval tVar5;
  long diff;
  long local_50;
  undefined1 local_48 [8];
  timeval set;
  curl_llist *list;
  int rc;
  timeval *nowp;
  Curl_multi *multi;
  long milli_local;
  SessionHandle *data_local;
  
  pCVar1 = data->multi;
  stamp = &(data->state).expiretime;
  if (pCVar1 != (Curl_multi *)0x0) {
    if (milli == 0) {
      if ((stamp->tv_sec != 0) || ((data->state).expiretime.tv_usec != 0)) {
        set.tv_usec = (__suseconds_t)(data->state).timeoutlist;
        uVar2 = Curl_splayremovebyaddr(pCVar1->timetree,&(data->state).timenode,&pCVar1->timetree);
        if (uVar2 != 0) {
          Curl_infof(data,"Internal error clearing splay node = %d\n",(ulong)uVar2);
        }
        while (*(long *)(set.tv_usec + 0x18) != 0) {
          Curl_llist_remove((curl_llist *)set.tv_usec,*(curl_llist_element **)(set.tv_usec + 8),
                            (void *)0x0);
        }
        stamp->tv_sec = 0;
        (data->state).expiretime.tv_usec = 0;
      }
    }
    else {
      tVar5 = curlx_tvnow();
      diff = tVar5.tv_sec;
      local_50 = tVar5.tv_usec;
      local_48 = (undefined1  [8])(milli / 1000 + diff);
      set.tv_sec = (milli % 1000) * 1000 + local_50;
      if (999999 < set.tv_sec) {
        local_48 = (undefined1  [8])((long)local_48 + 1);
        set.tv_sec = set.tv_sec + -1000000;
      }
      if ((stamp->tv_sec != 0) || ((data->state).expiretime.tv_usec != 0)) {
        tVar5.tv_usec = set.tv_sec;
        tVar5.tv_sec = (__time_t)local_48;
        lVar3 = curlx_tvdiff(tVar5,*stamp);
        if (0 < lVar3) {
          multi_addtimeout((data->state).timeoutlist,(timeval *)local_48);
          return;
        }
        multi_addtimeout((data->state).timeoutlist,stamp);
        uVar2 = Curl_splayremovebyaddr(pCVar1->timetree,&(data->state).timenode,&pCVar1->timetree);
        if (uVar2 != 0) {
          Curl_infof(data,"Internal error removing splay node = %d\n",(ulong)uVar2);
        }
      }
      stamp->tv_sec = (__time_t)local_48;
      (data->state).expiretime.tv_usec = set.tv_sec;
      (data->state).timenode.payload = data;
      pCVar4 = Curl_splayinsert(*stamp,pCVar1->timetree,&(data->state).timenode);
      pCVar1->timetree = pCVar4;
    }
  }
  return;
}

Assistant:

void Curl_expire(struct SessionHandle *data, long milli)
{
  struct Curl_multi *multi = data->multi;
  struct timeval *nowp = &data->state.expiretime;
  int rc;

  /* this is only interesting while there is still an associated multi struct
     remaining! */
  if(!multi)
    return;

  if(!milli) {
    /* No timeout, clear the time data. */
    if(nowp->tv_sec || nowp->tv_usec) {
      /* Since this is an cleared time, we must remove the previous entry from
         the splay tree */
      struct curl_llist *list = data->state.timeoutlist;

      rc = Curl_splayremovebyaddr(multi->timetree,
                                  &data->state.timenode,
                                  &multi->timetree);
      if(rc)
        infof(data, "Internal error clearing splay node = %d\n", rc);

      /* flush the timeout list too */
      while(list->size > 0)
        Curl_llist_remove(list, list->tail, NULL);

#ifdef DEBUGBUILD
      infof(data, "Expire cleared\n");
#endif
      nowp->tv_sec = 0;
      nowp->tv_usec = 0;
    }
  }
  else {
    struct timeval set;

    set = Curl_tvnow();
    set.tv_sec += milli/1000;
    set.tv_usec += (milli%1000)*1000;

    if(set.tv_usec >= 1000000) {
      set.tv_sec++;
      set.tv_usec -= 1000000;
    }

    if(nowp->tv_sec || nowp->tv_usec) {
      /* This means that the struct is added as a node in the splay tree.
         Compare if the new time is earlier, and only remove-old/add-new if it
         is. */
      long diff = curlx_tvdiff(set, *nowp);
      if(diff > 0) {
        /* the new expire time was later so just add it to the queue
           and get out */
        multi_addtimeout(data->state.timeoutlist, &set);
        return;
      }

      /* the new time is newer than the presently set one, so add the current
         to the queue and update the head */
      multi_addtimeout(data->state.timeoutlist, nowp);

      /* Since this is an updated time, we must remove the previous entry from
         the splay tree first and then re-add the new value */
      rc = Curl_splayremovebyaddr(multi->timetree,
                                  &data->state.timenode,
                                  &multi->timetree);
      if(rc)
        infof(data, "Internal error removing splay node = %d\n", rc);
    }

    *nowp = set;
    data->state.timenode.payload = data;
    multi->timetree = Curl_splayinsert(*nowp,
                                       multi->timetree,
                                       &data->state.timenode);
  }
#if 0
  Curl_splayprint(multi->timetree, 0, TRUE);
#endif
}